

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.cxx
# Opt level: O1

ptr<cluster_config> __thiscall
nuraft::cluster_config::deserialize(cluster_config *this,buffer_serializer *bs)

{
  _Alloc_hider _Var1;
  uint8_t uVar2;
  int32_t iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  void *pvVar6;
  undefined8 *puVar7;
  _List_node_base *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  int iVar10;
  ptr<cluster_config> pVar11;
  string user_ctx;
  size_t ctx_len;
  _List_node_base *local_68;
  _Alloc_hider _Stack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  size_t local_38;
  
  uVar4 = buffer_serializer::get_u64(bs);
  uVar5 = buffer_serializer::get_u64(bs);
  uVar2 = buffer_serializer::get_u8(bs);
  pvVar6 = buffer_serializer::get_bytes(bs,&local_38);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pvVar6,local_38 + (long)pvVar6)
  ;
  iVar3 = buffer_serializer::get_i32(bs);
  this->log_idx_ = 0;
  puVar7 = (undefined8 *)operator_new(0x60);
  puVar7[1] = 0x100000001;
  *puVar7 = &PTR___Sp_counted_ptr_inplace_002365b8;
  puVar7[2] = uVar4;
  puVar7[3] = uVar5;
  *(bool *)(puVar7 + 4) = uVar2 != '\0';
  puVar7[5] = puVar7 + 7;
  puVar7[6] = 0;
  *(undefined1 *)(puVar7 + 7) = 0;
  puVar7[9] = 0;
  puVar7[10] = 0;
  puVar7[10] = puVar7 + 9;
  puVar7[9] = puVar7 + 9;
  puVar7[0xb] = 0;
  this->prev_log_idx_ = (ulong)puVar7;
  this->log_idx_ = (ulong)(puVar7 + 2);
  if (0 < iVar3) {
    iVar10 = iVar3 + 1;
    do {
      srv_config::deserialize((srv_config *)&local_68,bs);
      p_Var8 = (_List_node_base *)operator_new(0x20);
      _Var1._M_p = _Stack_60._M_p;
      p_Var8[1]._M_prev = (_List_node_base *)0x0;
      _Stack_60._M_p = (pointer)0x0;
      p_Var8[1]._M_next = local_68;
      p_Var8[1]._M_prev = (_List_node_base *)_Var1._M_p;
      local_68 = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      puVar7[0xb] = puVar7[0xb] + 1;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_60._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_60._M_p);
      }
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  std::__cxx11::string::_M_assign((string *)(puVar7 + 5));
  _Var9._M_pi = extraout_RDX;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
    _Var9._M_pi = extraout_RDX_00;
  }
  pVar11.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  pVar11.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<cluster_config>)
         pVar11.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<cluster_config> cluster_config::deserialize(buffer_serializer& bs) {
    ulong log_idx = bs.get_u64();
    ulong prev_log_idx = bs.get_u64();

    byte ec_byte = bs.get_u8();
    bool ec = ec_byte ? true : false;

    size_t ctx_len;
    const byte* ctx_data = (const byte*)bs.get_bytes(ctx_len);
    std::string user_ctx = std::string((const char*)ctx_data, ctx_len);

    int32 cnt = bs.get_i32();
    ptr<cluster_config> conf = cs_new<cluster_config>(log_idx, prev_log_idx, ec);
    while (cnt -- > 0) {
        conf->get_servers().push_back(srv_config::deserialize(bs));
    }

    conf->set_user_ctx(user_ctx);

    return conf;
}